

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void kurtosis_double_suite::test_linear_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  double absolute_tolerance;
  double *in_stack_fffffffffffffaa8;
  double local_548;
  value_type local_540;
  value_type local_538;
  double local_528;
  value_type local_520;
  value_type local_518;
  double local_508;
  value_type local_500;
  value_type local_4f8;
  double local_4e8;
  value_type local_4e0;
  value_type local_4d8;
  double local_4c8;
  value_type local_4c0;
  value_type local_4b8;
  double local_4a8;
  value_type local_4a0;
  value_type local_498;
  double local_488;
  value_type local_480;
  value_type local_478;
  double local_468;
  value_type local_460;
  value_type local_458;
  double local_448;
  value_type local_440;
  value_type local_438;
  double local_428;
  value_type local_420;
  value_type local_418;
  double local_408;
  value_type local_400;
  value_type local_3f8;
  double local_3e8;
  value_type local_3e0;
  value_type local_3d8;
  double local_3c8;
  value_type local_3c0;
  value_type local_3b8;
  double local_3a8;
  value_type local_3a0;
  value_type local_398;
  double local_388;
  value_type local_380;
  value_type local_378;
  double local_368;
  value_type local_360;
  value_type local_358;
  double local_348;
  value_type local_340;
  value_type local_338;
  double local_328;
  value_type local_320;
  value_type local_318;
  double local_308;
  value_type local_300;
  value_type local_2f8;
  double local_2e8;
  value_type local_2e0;
  value_type local_2d8;
  double local_2c8;
  value_type local_2c0;
  value_type local_2b8;
  double local_2a8;
  value_type local_2a0;
  value_type local_298;
  double local_288;
  value_type local_280;
  value_type local_278;
  double local_268;
  value_type local_260;
  value_type local_258;
  double local_248;
  value_type local_240;
  value_type local_238;
  double local_228;
  value_type local_220;
  value_type local_218;
  double local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0 [4];
  undefined8 local_c0;
  value_type local_b8 [2];
  undefined8 local_a8;
  value_type local_a0 [2];
  undefined8 local_90;
  value_type local_88 [2];
  undefined1 local_78 [8];
  moment_kurtosis<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.normalization,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::basic_moment
            ((basic_moment<double,_(trial::online::with)4> *)local_78,0.125,0.25,0.25,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,1.0);
  local_88[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_90 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2ac,"void kurtosis_double_suite::test_linear_increase()",local_88,&local_90);
  local_a0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_a8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2ad,"void kurtosis_double_suite::test_linear_increase()",local_a0,&local_a8);
  local_b8[0] = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                          ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2ae,"void kurtosis_double_suite::test_linear_increase()",local_b8,&local_c0);
  local_e0[2] = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                          ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_e0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.kurtosis()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x2af,"void kurtosis_double_suite::test_linear_increase()",local_e0 + 2,local_e0 + 1);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,2.0);
  local_e0[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_e8 = 1.53333;
  local_f8 = filter.normalization;
  predicate_34.absolute = tolerance.relative;
  predicate_34.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b1,0x111cde,(char *)local_e0,&local_e8,in_stack_fffffffffffffaa8,
             predicate_34);
  local_100 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_108 = 0.124444;
  local_118 = filter.normalization;
  predicate_33.absolute = tolerance.relative;
  predicate_33.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b2,0x111cde,(char *)&local_100,&local_108,in_stack_fffffffffffffaa8,
             predicate_33);
  local_120 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_128 = 1.32288;
  local_138 = filter.normalization;
  predicate_32.absolute = tolerance.relative;
  predicate_32.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b3,0x111cde,(char *)&local_120,&local_128,in_stack_fffffffffffffaa8,
             predicate_32);
  local_140 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_148 = 1.75;
  local_158 = filter.normalization;
  predicate_31.absolute = tolerance.relative;
  predicate_31.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b4,0x111cde,(char *)&local_140,&local_148,in_stack_fffffffffffffaa8,
             predicate_31);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,3.0);
  local_160 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_168 = 2.08876;
  local_178 = filter.normalization;
  predicate_30.absolute = tolerance.relative;
  predicate_30.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b6,0x111cde,(char *)&local_160,&local_168,in_stack_fffffffffffffaa8,
             predicate_30);
  local_180 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_188 = 0.429707;
  local_198 = filter.normalization;
  predicate_29.absolute = tolerance.relative;
  predicate_29.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.429707","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b7,0x111cde,(char *)&local_180,&local_188,in_stack_fffffffffffffaa8,
             predicate_29);
  local_1a0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_1a8 = 1.27863;
  local_1b8 = filter.normalization;
  predicate_28.absolute = tolerance.relative;
  predicate_28.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.27863","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b8,0x111cde,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffaa8,
             predicate_28);
  local_1c0 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_1c8 = 1.69807;
  local_1d8 = filter.normalization;
  predicate_27.absolute = tolerance.relative;
  predicate_27.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.69807","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2b9,0x111cde,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffaa8,
             predicate_27);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,4.0);
  local_1e0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_1e8 = 2.66608;
  local_1f8 = filter.normalization;
  predicate_26.absolute = tolerance.relative;
  predicate_26.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66608","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2bb,0x111cde,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffaa8,
             predicate_26);
  local_200 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_208 = 0.923291;
  local_218 = filter.normalization;
  predicate_25.absolute = tolerance.relative;
  predicate_25.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.923291","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2bc,0x111cde,(char *)&local_200,&local_208,in_stack_fffffffffffffaa8,
             predicate_25);
  local_220 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_228 = 1.23592;
  local_238 = filter.normalization;
  predicate_24.absolute = tolerance.relative;
  predicate_24.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.23592","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2bd,0x111cde,(char *)&local_220,&local_228,in_stack_fffffffffffffaa8,
             predicate_24);
  local_240 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_248 = 1.59157;
  local_258 = filter.normalization;
  predicate_23.absolute = tolerance.relative;
  predicate_23.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.59157","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2be,0x111cde,(char *)&local_240,&local_248,in_stack_fffffffffffffaa8,
             predicate_23);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,5.0);
  local_260 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_268 = 3.26502;
  local_278 = filter.normalization;
  predicate_22.absolute = tolerance.relative;
  predicate_22.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.26502","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c0,0x111cde,(char *)&local_260,&local_268,in_stack_fffffffffffffaa8,
             predicate_22);
  local_280 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_288 = 1.60733;
  local_298 = filter.normalization;
  predicate_21.absolute = tolerance.relative;
  predicate_21.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.60733","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c1,0x111cde,(char *)&local_280,&local_288,in_stack_fffffffffffffaa8,
             predicate_21);
  local_2a0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_2a8 = 1.20177;
  local_2b8 = filter.normalization;
  predicate_20.absolute = tolerance.relative;
  predicate_20.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.20177","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c2,0x111cde,(char *)&local_2a0,&local_2a8,in_stack_fffffffffffffaa8,
             predicate_20);
  local_2c0 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_2c8 = 1.50264;
  local_2d8 = filter.normalization;
  predicate_19.absolute = tolerance.relative;
  predicate_19.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.50264","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c3,0x111cde,(char *)&local_2c0,&local_2c8,in_stack_fffffffffffffaa8,
             predicate_19);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,6.0);
  local_2e0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_2e8 = 3.88525;
  local_2f8 = filter.normalization;
  predicate_18.absolute = tolerance.relative;
  predicate_18.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.88525","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c5,0x111cde,(char *)&local_2e0,&local_2e8,in_stack_fffffffffffffaa8,
             predicate_18);
  local_300 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_308 = 2.47861;
  local_318 = filter.normalization;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.47861","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c6,0x111cde,(char *)&local_300,&local_308,in_stack_fffffffffffffaa8,
             predicate_17);
  local_320 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_328 = 1.1738;
  local_338 = filter.normalization;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1738","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c7,0x111cde,(char *)&local_320,&local_328,in_stack_fffffffffffffaa8,
             predicate_16);
  local_340 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_348 = 1.42982;
  local_358 = filter.normalization;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.42982","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2c8,0x111cde,(char *)&local_340,&local_348,in_stack_fffffffffffffaa8,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,7.0);
  local_360 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_368 = 4.52635;
  local_378 = filter.normalization;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.52635","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2ca,0x111cde,(char *)&local_360,&local_368,in_stack_fffffffffffffaa8,
             predicate_14);
  local_380 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_388 = 3.52889;
  local_398 = filter.normalization;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","3.52889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cb,0x111cde,(char *)&local_380,&local_388,in_stack_fffffffffffffaa8,
             predicate_13);
  local_3a0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_3a8 = 1.15036;
  local_3b8 = filter.normalization;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.15036","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cc,0x111cde,(char *)&local_3a0,&local_3a8,in_stack_fffffffffffffaa8,
             predicate_12);
  local_3c0 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_3c8 = 1.36931;
  local_3d8 = filter.normalization;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.36931","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cd,0x111cde,(char *)&local_3c0,&local_3c8,in_stack_fffffffffffffaa8,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,8.0);
  local_3e0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_3e8 = 5.18786;
  local_3f8 = filter.normalization;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.18786","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2cf,0x111cde,(char *)&local_3e0,&local_3e8,in_stack_fffffffffffffaa8,
             predicate_10);
  local_400 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_408 = 4.7455;
  local_418 = filter.normalization;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","4.7455","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d0,0x111cde,(char *)&local_400,&local_408,in_stack_fffffffffffffaa8,
             predicate_09);
  local_420 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_428 = 1.13038;
  local_438 = filter.normalization;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.13038","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d1,0x111cde,(char *)&local_420,&local_428,in_stack_fffffffffffffaa8,
             predicate_08);
  local_440 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_448 = 1.31835;
  local_458 = filter.normalization;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.31835","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d2,0x111cde,(char *)&local_440,&local_448,in_stack_fffffffffffffaa8,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,9.0);
  local_460 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_468 = 5.86924;
  local_478 = filter.normalization;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.86924","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d4,0x111cde,(char *)&local_460,&local_468,in_stack_fffffffffffffaa8,
             predicate_06);
  local_480 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_488 = 6.11216;
  local_498 = filter.normalization;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","6.11216","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d5,0x111cde,(char *)&local_480,&local_488,in_stack_fffffffffffffaa8,
             predicate_05);
  local_4a0 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_4a8 = 1.1132;
  local_4b8 = filter.normalization;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.1132","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d6,0x111cde,(char *)&local_4a0,&local_4a8,in_stack_fffffffffffffaa8,
             predicate_04);
  local_4c0 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_4c8 = 1.275;
  local_4d8 = filter.normalization;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.275","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d7,0x111cde,(char *)&local_4c0,&local_4c8,in_stack_fffffffffffffaa8,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)4>::push
            ((basic_moment<double,_(trial::online::with)4> *)local_78,10.0);
  local_4e0 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_78);
  local_4e8 = 6.56991;
  local_4f8 = filter.normalization;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.56991","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2d9,0x111cde,(char *)&local_4e0,&local_4e8,in_stack_fffffffffffffaa8,
             predicate_02);
  local_500 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_78);
  local_508 = 7.60984;
  local_518 = filter.normalization;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","7.60984","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2da,0x111cde,(char *)&local_500,&local_508,in_stack_fffffffffffffaa8,
             predicate_01);
  local_520 = trial::online::decay::basic_moment<double,_(trial::online::with)3>::skewness
                        ((basic_moment<double,_(trial::online::with)3> *)local_78);
  local_528 = 1.09832;
  local_538 = filter.normalization;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.09832","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2db,0x111cde,(char *)&local_520,&local_528,in_stack_fffffffffffffaa8,
             predicate_00);
  local_540 = trial::online::decay::basic_moment<double,_(trial::online::with)4>::kurtosis
                        ((basic_moment<double,_(trial::online::with)4> *)local_78);
  local_548 = 1.23788;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.normalization;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.kurtosis()","1.23788","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x2dc,0x111cde,(char *)&local_540,&local_548,(double *)filter.normalization,
             predicate);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_kurtosis<double> filter(one_over_eight, one_over_four, one_over_four, one_over_four);

    // Cumulative kurtosis converges towards 1.8

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.kurtosis(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.75, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 2.08876, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.429707, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.27863, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.69807, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66608, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.923291, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.23592, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.59157, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 3.26502, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.60733, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.20177, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.50264, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 3.88525, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.47861, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1738, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.42982, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 4.52635, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 3.52889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.15036, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.36931, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 5.18786, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 4.7455, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.13038, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.31835, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 5.86924, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 6.11216, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.1132, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.275, tolerance);
    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 6.56991, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 7.60984, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.09832, tolerance);
    TRIAL_TEST_WITH(filter.kurtosis(), 1.23788, tolerance);
}